

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O1

void __thiscall
Assimp::DXFImporter::ParsePolyLine(DXFImporter *this,LineReader *reader,FileData *output)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  pointer pBVar1;
  PolyLine *line;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Logger *pLVar7;
  LineReader *reader_00;
  ulong uVar8;
  LineReader *this_03;
  ulong uVar9;
  uint uVar10;
  uint local_1f4;
  long *local_1e8;
  long local_1d8 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1c8;
  string *local_1c0;
  string *local_1b8;
  FileData *local_1b0;
  undefined1 local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0 [13];
  ios_base local_138 [264];
  
  pBVar1 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_1a8 = (undefined1  [8])operator_new(0xa8);
  (((PolyLine *)local_1a8)->positions).
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((PolyLine *)local_1a8)->positions).
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (((PolyLine *)local_1a8)->positions).
  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((PolyLine *)local_1a8)->colors).
  super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (((PolyLine *)local_1a8)->colors).
  super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (((PolyLine *)local_1a8)->colors).
  super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((PolyLine *)local_1a8)->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((PolyLine *)local_1a8)->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((PolyLine *)local_1a8)->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((PolyLine *)local_1a8)->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((PolyLine *)local_1a8)->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((PolyLine *)local_1a8)->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((PolyLine *)local_1a8)->flags = 0;
  (((PolyLine *)local_1a8)->layer)._M_dataplus._M_p =
       (pointer)&(((PolyLine *)local_1a8)->layer).field_2;
  (((PolyLine *)local_1a8)->layer)._M_string_length = 0;
  (((PolyLine *)local_1a8)->layer).field_2._M_local_buf[0] = '\0';
  (((PolyLine *)local_1a8)->desc)._M_dataplus._M_p =
       (pointer)&(((PolyLine *)local_1a8)->desc).field_2;
  (((PolyLine *)local_1a8)->desc)._M_string_length = 0;
  (((PolyLine *)local_1a8)->desc).field_2._M_local_buf[0] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::DXF::PolyLine*>
            (local_1a0,(PolyLine *)local_1a8);
  std::
  vector<std::shared_ptr<Assimp::DXF::PolyLine>,std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>>>
  ::emplace_back<std::shared_ptr<Assimp::DXF::PolyLine>>
            ((vector<std::shared_ptr<Assimp::DXF::PolyLine>,std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>>>
              *)(pBVar1 + -1),(shared_ptr<Assimp::DXF::PolyLine> *)local_1a8);
  if (local_1a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0[0]._M_pi);
  }
  line = (output->blocks).
         super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].lines.
         super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar10 = 0;
  local_1f4 = 0;
  local_1b0 = output;
  if (reader->end < 2) {
    local_1b8 = &reader->value;
    local_1c0 = (string *)&line->layer;
    local_1c8 = &line->indices;
    local_1f4 = 0;
    uVar10 = 0;
    do {
      while( true ) {
        iVar5 = reader->groupcode;
        if (iVar5 != 0) break;
        iVar4 = strcmp("ENDSEC",(reader->value)._M_dataplus._M_p);
        if (iVar4 == 0) goto LAB_004491e5;
        if ((iVar5 != 0) || (iVar4 = strcmp("VERTEX",(reader->value)._M_dataplus._M_p), iVar4 != 0))
        break;
        this_03 = reader;
        reader_00 = DXF::LineReader::operator++(reader);
        ParsePolyLineVertex((DXFImporter *)this_03,reader_00,line);
        if (((reader->groupcode == 0) &&
            (iVar5 = strcmp("SEQEND",(reader->value)._M_dataplus._M_p), iVar5 == 0)) ||
           (1 < reader->end)) goto LAB_004491e5;
      }
      if (iVar5 < 0x47) {
        if (iVar5 == 8) {
          std::__cxx11::string::_M_assign(local_1c0);
        }
        else if ((iVar5 == 0x46) && (line->flags == 0)) {
          uVar6 = DXF::LineReader::ValueAsSignedInt(reader);
          line->flags = uVar6;
        }
      }
      else if (iVar5 == 0x47) {
        uVar10 = DXF::LineReader::ValueAsSignedInt(reader);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                  (&line->positions,(ulong)uVar10);
      }
      else if (iVar5 == 0x48) {
        local_1f4 = DXF::LineReader::ValueAsSignedInt(reader);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                  (local_1c8,(ulong)local_1f4);
      }
      DXF::LineReader::operator++(reader);
    } while (reader->end < 2);
  }
LAB_004491e5:
  if ((uVar10 != 0) &&
     (((long)(line->positions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(line->positions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - (ulong)uVar10 != 0)) {
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[43]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [43])"DXF: unexpected vertex count in polymesh: ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", expected ",0xb);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar7,(char *)local_1e8);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if ((line->flags & 0x40) == 0) {
    if (((line->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish ==
         (line->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start) &&
       ((line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      this_00 = &line->indices;
      this_01 = &line->counts;
      uVar9 = (ulong)(line->flags & 1) +
              ((long)(line->positions).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(line->positions).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_00,uVar9);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_01,uVar9 >> 1);
      uVar9 = ((long)(line->positions).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(line->positions).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      if (1 < uVar9) {
        uVar10 = 1;
        uVar8 = 1;
        do {
          local_1a8._0_4_ = uVar10 - 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (this_00,(uint *)local_1a8);
          local_1a8._0_4_ = uVar10;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (this_00,(uint *)local_1a8);
          local_1a8._0_4_ = 2;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (this_01,(uint *)local_1a8);
          uVar9 = ((long)(line->positions).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(line->positions).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
          uVar10 = uVar10 + 2;
          bVar3 = uVar8 < uVar9 >> 1;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar3);
      }
      if ((line->flags & 1) != 0) {
        local_1a8._0_4_ = (int)uVar9 - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_00,(uint *)local_1a8);
        local_1a8._0_4_ = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_00,(uint *)local_1a8);
        local_1a8._0_4_ = 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_01,(uint *)local_1a8);
      }
    }
  }
  else if (((ulong)(((long)(line->positions).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(line->positions).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
            3) || ((ulong)((long)(line->indices).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(line->indices).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) < 9)) {
    pLVar7 = DefaultLogger::get();
    Logger::warn(pLVar7,"DXF: not enough vertices for polymesh; ignoring");
    pBVar1 = (local_1b0->blocks).
             super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
             super__Vector_impl_data._M_finish;
    psVar2 = pBVar1[-1].lines.
             super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar1[-1].lines.
    super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar2 + -1;
    this_02 = psVar2[-1].super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
    }
  }
  else if ((local_1f4 != 0) &&
          ((long)(line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(line->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2 != (ulong)local_1f4)) {
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[41]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [41])"DXF: unexpected face count in polymesh: ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", expected ",0xb);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar7,(char *)local_1e8);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void DXFImporter::ParsePolyLine(DXF::LineReader& reader, DXF::FileData& output) {
    output.blocks.back().lines.push_back( std::shared_ptr<DXF::PolyLine>( new DXF::PolyLine() ) );
    DXF::PolyLine& line = *output.blocks.back().lines.back();

    unsigned int iguess = 0, vguess = 0;
    while( !reader.End() && !reader.Is(0,"ENDSEC")) {

        if (reader.Is(0,"VERTEX")) {
            ParsePolyLineVertex(++reader,line);
            if (reader.Is(0,"SEQEND")) {
                break;
            }
            continue;
        }

        switch(reader.GroupCode())
        {
        // flags --- important that we know whether it is a
        // polyface mesh or 'just' a line.
        case 70:
            if (!line.flags)    {
                line.flags = reader.ValueAsSignedInt();
            }
            break;

        // optional number of vertices
        case 71:
            vguess = reader.ValueAsSignedInt();
            line.positions.reserve(vguess);
            break;

        // optional number of faces
        case 72:
            iguess = reader.ValueAsSignedInt();
            line.indices.reserve(iguess);
            break;

        // 8 specifies the layer on which this line is placed on
        case 8:
            line.layer = reader.Value();
            break;
        }

        reader++;
    }

    //if (!(line.flags & DXF_POLYLINE_FLAG_POLYFACEMESH))   {
    //  DefaultLogger::get()->warn((Formatter::format("DXF: polyline not currently supported: "),line.flags));
    //  output.blocks.back().lines.pop_back();
    //  return;
    //}

    if (vguess && line.positions.size() != vguess) {
        ASSIMP_LOG_WARN_F("DXF: unexpected vertex count in polymesh: ",
            line.positions.size(),", expected ", vguess );
    }

    if (line.flags & DXF_POLYLINE_FLAG_POLYFACEMESH ) {
        if (line.positions.size() < 3 || line.indices.size() < 3)   {
            ASSIMP_LOG_WARN("DXF: not enough vertices for polymesh; ignoring");
            output.blocks.back().lines.pop_back();
            return;
        }

        // if these numbers are wrong, parsing might have gone wild.
        // however, the docs state that applications are not required
        // to set the 71 and 72 fields, respectively, to valid values.
        // So just fire a warning.
        if (iguess && line.counts.size() != iguess) {
            ASSIMP_LOG_WARN_F( "DXF: unexpected face count in polymesh: ", line.counts.size(),", expected ", iguess );
        }
    }
    else if (!line.indices.size() && !line.counts.size()) {
        // a poly-line - so there are no indices yet.
        size_t guess = line.positions.size() + (line.flags & DXF_POLYLINE_FLAG_CLOSED ? 1 : 0);
        line.indices.reserve(guess);

        line.counts.reserve(guess/2);
        for (unsigned int i = 0; i < line.positions.size()/2; ++i) {
            line.indices.push_back(i*2);
            line.indices.push_back(i*2+1);
            line.counts.push_back(2);
        }

        // closed polyline?
        if (line.flags & DXF_POLYLINE_FLAG_CLOSED) {
            line.indices.push_back(static_cast<unsigned int>(line.positions.size()-1));
            line.indices.push_back(0);
            line.counts.push_back(2);
        }
    }
}